

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
duckdb::InvalidInputException::
InvalidInputException<std::__cxx11::string,unsigned_long,unsigned_long>
          (InvalidInputException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          unsigned_long params_1,unsigned_long params_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string *in_RDX;
  InvalidInputException *in_RDI;
  unsigned_long in_R8;
  string local_68 [32];
  string local_48 [24];
  unsigned_long in_stack_ffffffffffffffd0;
  
  std::__cxx11::string::string(local_68,(string *)in_RDX);
  Exception::ConstructMessage<std::__cxx11::string,unsigned_long,unsigned_long>
            (in_RDX,in_RCX,in_R8,in_stack_ffffffffffffffd0);
  duckdb::InvalidInputException::InvalidInputException(in_RDI,local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

explicit InvalidInputException(const string &msg, ARGS... params)
	    : InvalidInputException(ConstructMessage(msg, params...)) {
	}